

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

Diagnostic * __thiscall
slang::ast::Scope::addDiag(Scope *this,DiagCode code,SourceLocation location)

{
  Compilation *this_00;
  Diagnostic *pDVar1;
  Diagnostic local_80;
  
  this_00 = this->compilation;
  Diagnostic::Diagnostic(&local_80,this->thisSym,code,location);
  pDVar1 = Compilation::addDiag(this_00,&local_80);
  std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector(&local_80.notes);
  if (local_80.ranges.super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.ranges.
                    super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.ranges.
                          super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.ranges.
                          super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ::~vector(&local_80.args);
  return pDVar1;
}

Assistant:

Diagnostic& Scope::addDiag(DiagCode code, SourceLocation location) const {
    return compilation.addDiag(Diagnostic(*thisSym, code, location));
}